

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitileave.hpp
# Opt level: O3

ull_type bitmanip::detail::ileave_arr_impl<unsigned_int,0ul,1ul,2ul>(uint *param_1)

{
  uint64_t n;
  ulong uVar1;
  int i;
  long lVar2;
  ulong uVar3;
  uint64_t n_1;
  ulong uVar4;
  bool bVar5;
  ulong local_48 [6];
  
  uVar1 = (ulong)*param_1;
  local_48[0] = 0x9249249249249249;
  local_48[1] = 0x30c30c30c30c30c3;
  local_48[2] = 0xf00f00f00f00f00f;
  local_48[3] = 0xff0000ff0000ff;
  local_48[4] = 0xffff00000000ffff;
  lVar2 = 4;
  do {
    uVar1 = (uVar1 | uVar1 << ((byte)(2 << ((byte)lVar2 & 0x1f)) & 0x3f)) & local_48[lVar2];
    bVar5 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar5);
  uVar4 = (ulong)param_1[1];
  local_48[0] = 0x9249249249249249;
  local_48[1] = 0x30c30c30c30c30c3;
  local_48[2] = 0xf00f00f00f00f00f;
  local_48[3] = 0xff0000ff0000ff;
  local_48[4] = 0xffff00000000ffff;
  lVar2 = 4;
  do {
    uVar4 = (uVar4 | uVar4 << ((byte)(2 << ((byte)lVar2 & 0x1f)) & 0x3f)) & local_48[lVar2];
    bVar5 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar5);
  uVar3 = (ulong)param_1[2];
  local_48[0] = 0x9249249249249249;
  local_48[1] = 0x30c30c30c30c30c3;
  local_48[2] = 0xf00f00f00f00f00f;
  local_48[3] = 0xff0000ff0000ff;
  local_48[4] = 0xffff00000000ffff;
  lVar2 = 4;
  do {
    uVar3 = (uVar3 | uVar3 << ((byte)(2 << ((byte)lVar2 & 0x1f)) & 0x3f)) & local_48[lVar2];
    bVar5 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar5);
  return uVar1 << 2 | uVar4 * 2 | uVar3;
}

Assistant:

[[nodiscard]] constexpr auto ileave_arr_impl(std::index_sequence<I...>, Uint args[]) noexcept -> ull_type
{
    constexpr std::size_t max = sizeof...(I) - 1;
    return (ileaveZeros_const<max, max - I>(args[I]) | ...);
}